

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

iterator __thiscall Json::Value::end(Value *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  long *in_RSI;
  iterator iVar2;
  iterator local_10;
  
  if (*in_RSI == 0 || (*(ushort *)(in_RSI + 1) & 0xfe) != 6) {
    ValueIterator::ValueIterator((ValueIterator *)this);
    uVar1 = extraout_RDX;
  }
  else {
    local_10._M_node = (_Base_ptr)(*in_RSI + 8);
    ValueIterator::ValueIterator((ValueIterator *)this,&local_10);
    uVar1 = extraout_RDX_00;
  }
  iVar2.super_ValueIteratorBase._8_8_ = uVar1;
  iVar2.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this;
  return (iterator)iVar2.super_ValueIteratorBase;
}

Assistant:

Value::iterator 
Value::end()
{
   switch ( type_ )
   {
#ifdef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
      if ( value_.array_ )
      {
         ValueInternalArray::IteratorState it;
         value_.array_->makeEndIterator( it );
         return iterator( it );
      }
      break;
   case objectValue:
      if ( value_.map_ )
      {
         ValueInternalMap::IteratorState it;
         value_.map_->makeEndIterator( it );
         return iterator( it );
      }
      break;
#else
   case arrayValue:
   case objectValue:
      if ( value_.map_ )
         return iterator( value_.map_->end() );
      break;
#endif
   default:
      break;
   }
   return iterator();
}